

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O3

void __thiscall xsettingsd::SettingsManager::~SettingsManager(SettingsManager *this)

{
  pointer puVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Display *pDVar4;
  
  pDVar4 = this->display_;
  if (pDVar4 != (Display *)0x0) {
    if ((this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      DestroyWindows(this);
      pDVar4 = this->display_;
    }
    XCloseDisplay(pDVar4);
    this->display_ = (Display *)0x0;
  }
  puVar1 = (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->windows_).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  SettingsMap::~SettingsMap(&this->settings_);
  pcVar2 = (this->config_filename_)._M_dataplus._M_p;
  paVar3 = &(this->config_filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

SettingsManager::~SettingsManager() {
  if (display_) {
    if (!windows_.empty())
      DestroyWindows();
    XCloseDisplay(display_);
    display_ = NULL;
  }
}